

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O2

Vec_Int_t * Gia_ManLutCollect2(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *__assertion;
  long lVar11;
  
  iVar2 = Gia_ManLutNum(p);
  p_00 = Vec_IntAlloc(iVar2);
  Gia_ManIncrementTravId(p);
  iVar2 = 0;
  do {
    if (p->vCos->nSize <= iVar2) {
      iVar2 = 0;
      while( true ) {
        uVar1 = p_00->nSize;
        uVar9 = (ulong)uVar1;
        if ((int)uVar1 <= iVar2) break;
        iVar3 = Vec_IntEntry(p_00,iVar2);
        lVar11 = 0;
        while( true ) {
          iVar4 = Gia_ObjLutSize(p,iVar3);
          if (iVar4 <= lVar11) break;
          piVar7 = Gia_ObjLutFanins(p,iVar3);
          iVar4 = piVar7[lVar11];
          pGVar6 = Gia_ManObj(p,iVar4);
          if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
            iVar5 = Gia_ObjIsLut(p,iVar4);
            if (iVar5 == 0) {
              __assertion = "Gia_ObjIsLut(p, iFan)";
              uVar1 = 0x45;
              goto LAB_0060eadb;
            }
            iVar5 = Gia_ObjIsTravIdCurrentId(p,iVar4);
            if (iVar5 == 0) {
              Gia_ObjSetTravIdCurrentId(p,iVar4);
              Vec_IntPush(p_00,iVar4);
            }
          }
          lVar11 = lVar11 + 1;
        }
        iVar2 = iVar2 + 1;
      }
      if (uVar1 == p_00->nCap || p_00->nCap == 0x10) {
        uVar10 = 0;
        uVar8 = (long)(int)uVar1 / 2 & 0xffffffff;
        if ((int)((long)(int)uVar1 / 2) < 1) {
          uVar8 = uVar10;
        }
        for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          piVar7 = p_00->pArray;
          iVar2 = piVar7[uVar10];
          uVar9 = (ulong)((int)uVar9 + -1);
          piVar7[uVar10] = piVar7[uVar9];
          piVar7[uVar9] = iVar2;
        }
        return p_00;
      }
      __assertion = "Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder)";
      uVar1 = 0x4c;
LAB_0060eadb:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,uVar1,"Vec_Int_t *Gia_ManLutCollect2(Gia_Man_t *)");
    }
    pGVar6 = Gia_ManCo(p,iVar2);
    uVar9 = (ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff);
    if ((~*(uint *)(pGVar6 + -uVar9) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar6 + -uVar9)) {
      iVar3 = Gia_ObjId(p,pGVar6 + -uVar9);
      iVar4 = Gia_ObjIsLut(p,iVar3);
      if (iVar4 == 0) {
        __assertion = "Gia_ObjIsLut(p, Id)";
        uVar1 = 0x39;
        goto LAB_0060eadb;
      }
      iVar4 = Gia_ObjIsTravIdCurrentId(p,iVar3);
      if (iVar4 == 0) {
        Gia_ObjSetTravIdCurrentId(p,iVar3);
        Vec_IntPush(p_00,iVar3);
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects LUT nodes in the increasing order of distance from COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_ManLutCollect2( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOrder;
    int i, k, Id, iFan;
    vOrder = Vec_IntAlloc( Gia_ManLutNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        Id = Gia_ObjId( p, pObj );
        assert( Gia_ObjIsLut(p, Id) );
        if ( Gia_ObjIsTravIdCurrentId(p, Id) )
            continue;
        Gia_ObjSetTravIdCurrentId(p, Id);
        Vec_IntPush( vOrder, Id );
    }
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            if ( !Gia_ObjIsAnd(Gia_ManObj(p, iFan)) )
                continue;
            assert( Gia_ObjIsLut(p, iFan) );
            if ( Gia_ObjIsTravIdCurrentId(p, iFan) )
                continue;
            Gia_ObjSetTravIdCurrentId(p, iFan);
            Vec_IntPush( vOrder, iFan );
        }
    }
    assert( Vec_IntCap(vOrder) == 16 || Vec_IntSize(vOrder) == Vec_IntCap(vOrder) );
    Vec_IntReverseOrder( vOrder );
    return vOrder;
}